

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sealwrap.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Sealwrap::start_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Sealwrap *this)

{
  Client *client;
  Url local_78;
  _Hashtable<_ea4cb122_> local_58;
  
  client = *(Client **)this;
  getUrl_abi_cxx11_(&local_78,this);
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_bucket_count = 1;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._4_4_ = 0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  HttpConsumer::post(__return_storage_ptr__,client,&local_78,(Parameters *)&local_58);
  std::_Hashtable<$ea4cb122$>::~_Hashtable(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.value_._M_dataplus._M_p != &local_78.value_.field_2) {
    operator_delete(local_78.value_._M_dataplus._M_p,
                    local_78.value_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::Sealwrap::start() {
  return HttpConsumer::post(client_, getUrl(), Parameters{});
}